

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O3

void __thiscall ON_HatchPattern::SetFillType(ON_HatchPattern *this,HatchFillType type)

{
  if (this->m_type == type) {
    return;
  }
  if (type == Solid) {
    ON_ClassArray<ON_HatchLine>::SetCapacity(&this->m_lines,0);
  }
  else if (type != Lines) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_hatch.cpp"
               ,0x260,"","Invalid hatch_fill_type_as_unsigned value.");
    return;
  }
  this->m_type = type;
  ON_ModelComponent::IncrementContentVersionNumber(&this->super_ON_ModelComponent);
  return;
}

Assistant:

void ON_HatchPattern::SetFillType( ON_HatchPattern::HatchFillType type)
{
  if ( m_type != type && type == ON_HatchPattern::HatchFillTypeFromUnsigned(static_cast<unsigned int>(type)) )
  {
    if (ON_HatchPattern::HatchFillType::Lines != type)
      m_lines.Destroy();
    m_type = type;
    IncrementContentVersionNumber();
  }
}